

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

int __thiscall deqp::gls::DrawTestSpec::hash(DrawTestSpec *this)

{
  Primitive PVar1;
  int iVar2;
  DrawMethod DVar3;
  MethodInfo MVar4;
  size_type sVar5;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int basicHash;
  int baseVtxHash;
  int indirectHash;
  int instanceHash;
  int indexRangeHash;
  int arrayHash;
  int indexHash;
  bool hasBaseVtx;
  bool indirect;
  bool indexed;
  bool ranged;
  bool instanced;
  bool arrayed;
  MethodInfo methodInfo;
  DrawTestSpec *this_local;
  
  MVar4 = anon_unknown_1::getMethodInfo(this->drawMethod);
  if (((uint6)MVar4 & 1) == 0) {
    local_44 = 0;
  }
  else {
    local_44 = this->indexType + this->indexPointerOffset * 10 + this->indexStorage * 100;
  }
  if (((uint6)MVar4 & 0x1000000) == 0) {
    local_48 = 0;
  }
  else {
    local_48 = this->first;
  }
  if (((uint6)MVar4 & 0x10000) == 0) {
    local_4c = 0;
  }
  else {
    local_4c = this->indexMin + this->indexMax * 10;
  }
  if (((uint6)MVar4 & 0x100) == 0) {
    local_50 = 0;
  }
  else {
    local_50 = this->instanceCount;
  }
  if (((uint6)MVar4 & 0x10000000000) == 0) {
    local_54 = 0;
  }
  else {
    local_54 = this->indirectOffset;
  }
  if (((uint6)MVar4 & 0x100000000) == 0) {
    local_58 = 0;
  }
  else {
    local_58 = this->baseVertex;
  }
  PVar1 = this->primitive;
  iVar2 = this->primitiveCount;
  DVar3 = this->drawMethod;
  sVar5 = std::
          vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
          ::size(&this->attribs);
  return local_44 + local_48 * 3 + local_4c * 5 + local_50 * 7 +
         (PVar1 + iVar2 * 10 + DVar3 * 100) * 0xd + (int)sVar5 * 0x11 + this->primitiveCount * 0x13
         + local_54 * 0x17 + local_58 * 0x1b;
}

Assistant:

int DrawTestSpec::hash (void) const
{
	// Use only drawmode-relevant values in "hashing" as the unrelevant values might not be set (causing non-deterministic behavior).
	const MethodInfo	methodInfo		= getMethodInfo(drawMethod);
	const bool			arrayed			= methodInfo.first;
	const bool			instanced		= methodInfo.instanced;
	const bool			ranged			= methodInfo.ranged;
	const bool			indexed			= methodInfo.indexed;
	const bool			indirect		= methodInfo.indirect;
	const bool			hasBaseVtx		= methodInfo.baseVertex;

	const int			indexHash		= (!indexed)	? (0) : (int(indexType) + 10 * indexPointerOffset + 100 * int(indexStorage));
	const int			arrayHash		= (!arrayed)	? (0) : (first);
	const int			indexRangeHash	= (!ranged)		? (0) : (indexMin + 10 * indexMax);
	const int			instanceHash	= (!instanced)	? (0) : (instanceCount);
	const int			indirectHash	= (!indirect)	? (0) : (indirectOffset);
	const int			baseVtxHash		= (!hasBaseVtx)	? (0) : (baseVertex);
	const int			basicHash		= int(primitive) + 10 * primitiveCount + 100 * int(drawMethod);

	return indexHash + 3 * arrayHash + 5 * indexRangeHash + 7 * instanceHash + 13 * basicHash + 17 * (int)attribs.size() + 19 * primitiveCount + 23 * indirectHash + 27 * baseVtxHash;
}